

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,false>
               (string_t *ldata,date_t *rdata,date_t *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  date_t dVar3;
  date_t *pdVar4;
  date_t *pdVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  char **ppcVar11;
  ulong uVar12;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  char **local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(ldata->value).pointer.ptr;
      iVar9 = 0;
      iVar6 = count;
      do {
        specifier_01.value._8_4_ = rdata[iVar9].days;
        specifier_01.value._0_8_ = *local_70;
        specifier_01.value._12_4_ = 0;
        dVar3 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                          (*(DateTruncBinaryOperator **)(local_70 + -1),specifier_01,(int32_t)iVar6)
        ;
        result_data[iVar9].days = dVar3.days;
        iVar9 = iVar9 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    pdVar4 = (date_t *)0x0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
LAB_019c6698:
        uVar8 = uVar10;
        if (uVar10 < uVar7) {
          ppcVar11 = &ldata[uVar10].value.pointer.ptr;
          pdVar5 = pdVar4;
          do {
            specifier.value._8_4_ = rdata[uVar10].days;
            specifier.value._0_8_ = *ppcVar11;
            specifier.value._12_4_ = 0;
            dVar3 = DateTruncBinaryOperator::
                    Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                              (*(DateTruncBinaryOperator **)(ppcVar11 + -1),specifier,
                               (int32_t)pdVar5);
            result_data[uVar10].days = dVar3.days;
            uVar10 = uVar10 + 1;
            ppcVar11 = ppcVar11 + 2;
            uVar8 = uVar7;
          } while (uVar7 != uVar10);
        }
      }
      else {
        uVar2 = puVar1[(long)pdVar4];
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_019c6698;
          uVar8 = uVar10;
          if (uVar10 < uVar7) {
            ppcVar11 = &ldata[uVar10].value.pointer.ptr;
            uVar12 = 0;
            pdVar5 = pdVar4;
            do {
              if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
                specifier_00.value._8_4_ = rdata[uVar10 + uVar12].days;
                specifier_00.value._0_8_ = *ppcVar11;
                specifier_00.value._12_4_ = 0;
                dVar3 = DateTruncBinaryOperator::
                        Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
                                  (*(DateTruncBinaryOperator **)(ppcVar11 + -1),specifier_00,
                                   (int32_t)pdVar5);
                (result_data + uVar10)[uVar12].days = dVar3.days;
                pdVar5 = result_data + uVar10;
              }
              uVar12 = uVar12 + 1;
              ppcVar11 = ppcVar11 + 2;
              uVar8 = uVar7;
            } while (uVar7 - uVar10 != uVar12);
          }
        }
      }
      pdVar4 = (date_t *)((long)&pdVar4->days + 1);
      uVar10 = uVar8;
    } while (pdVar4 != (date_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}